

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

mcu8str * mcplcfg_show_item_lookup(mcu8str *__return_storage_ptr__,nccfgstate *state,char *item)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  size_t sStack_20;
  
  cVar1 = *item;
  if (cVar1 == 'b') {
    iVar2 = strncmp(item,"bindir",7);
    if (iVar2 == 0) {
      mcplcfg_bindir(__return_storage_ptr__,state);
      return __return_storage_ptr__;
    }
    iVar2 = strncmp(item,"buildflags",0xb);
    if (iVar2 == 0) {
      mcplcfg_buildflags(__return_storage_ptr__,state);
      return __return_storage_ptr__;
    }
    iVar2 = strncmp(item,"build_type",0xb);
    if (iVar2 != 0) goto LAB_001019ec;
    pcVar3 = "Release";
LAB_00101a56:
    mcu8str_view_cstr(__return_storage_ptr__,pcVar3);
    return __return_storage_ptr__;
  }
  if (cVar1 == 'c') {
    iVar2 = strncmp(item,"cmakedir",9);
    if (iVar2 == 0) {
      mcplcfg_cmakedir(__return_storage_ptr__,state);
      return __return_storage_ptr__;
    }
  }
  else if (cVar1 == 'i') {
    iVar2 = strncmp(item,"intversion",0xb);
    if (iVar2 == 0) {
      pcVar3 = "2000000";
      goto LAB_00101a56;
    }
    iVar2 = strncmp(item,"includedir",0xb);
    if (iVar2 == 0) {
      mcplcfg_incdir(__return_storage_ptr__,state);
      return __return_storage_ptr__;
    }
  }
  else {
    if (cVar1 == 'l') {
      iVar2 = strncmp(item,"libpath",8);
      if (iVar2 == 0) {
        mcplcfg_libpath(__return_storage_ptr__,state);
        return __return_storage_ptr__;
      }
      iVar2 = strncmp(item,"libdir",7);
      if (iVar2 == 0) {
        mcplcfg_libdir(__return_storage_ptr__,state);
        return __return_storage_ptr__;
      }
      pcVar3 = "libname";
      sStack_20 = 8;
    }
    else {
      if (cVar1 == 'v') {
        iVar2 = strncmp(item,"version",8);
        if (iVar2 == 0) {
          pcVar3 = "2.0.0";
          goto LAB_00101a56;
        }
        goto LAB_001019ec;
      }
      if (cVar1 != 's') goto LAB_001019ec;
      iVar2 = strncmp(item,"shlibpath",10);
      if (iVar2 == 0) {
        mcplcfg_shlibpath(__return_storage_ptr__,state);
        return __return_storage_ptr__;
      }
      iVar2 = strncmp(item,"shlibdir",9);
      if (iVar2 == 0) {
        mcplcfg_shlibdir(__return_storage_ptr__,state);
        return __return_storage_ptr__;
      }
      pcVar3 = "shlibname";
      sStack_20 = 10;
    }
    iVar2 = strncmp(item,pcVar3,sStack_20);
    if (iVar2 == 0) {
      pcVar3 = "libmcpl.so";
      goto LAB_00101a56;
    }
  }
LAB_001019ec:
  __return_storage_ptr__->c_str = (char *)0x0;
  __return_storage_ptr__->size = 0;
  __return_storage_ptr__->buflen = 0;
  __return_storage_ptr__->owns_memory = 0;
  return __return_storage_ptr__;
}

Assistant:

mcu8str mcplcfg_show_item_lookup( nccfgstate* state,
                                const char* item )
{
  //Lookup string value of named item. Returns invalid string (with
  //c_str=nullptr) in case name not recognised. Synchronize with implementation
  //of mcplcfg_show_item_list function).

  //All options (libpath first since it might be used by e.g. the python
  //modules):
  if ( MCPLCFG_STREQUALCONST(item,"shlibpath") )
    return mcplcfg_shlibpath(state);

  if ( MCPLCFG_STREQUALCONST(item,"libpath") )
    return mcplcfg_libpath(state);

  /* if ( MCPLCFG_STREQUALCONST(item,"namespace") ) */
  /*   return mcu8str_view_cstr(mcplcfg_const_namespace()); */

  if ( MCPLCFG_STREQUALCONST(item,"version") )
    return mcu8str_view_cstr(mcplcfg_const_version());

  if ( MCPLCFG_STREQUALCONST(item,"intversion") )
    return mcu8str_view_cstr(mcplcfg_const_intversion());

  if ( MCPLCFG_STREQUALCONST(item,"bindir") )
    return mcplcfg_bindir(state);

  if ( MCPLCFG_STREQUALCONST(item,"libdir") )
    return mcplcfg_libdir(state);

  if ( MCPLCFG_STREQUALCONST(item,"shlibdir") )
    return mcplcfg_shlibdir(state);

  if ( MCPLCFG_STREQUALCONST(item,"includedir") )
    return mcplcfg_incdir(state);

  if ( MCPLCFG_STREQUALCONST(item,"buildflags") )
    return mcplcfg_buildflags( state );

  if ( MCPLCFG_STREQUALCONST(item,"libname") )
    return mcu8str_view_cstr(mcplcfg_const_libname());

  if ( MCPLCFG_STREQUALCONST(item,"shlibname") )
    return mcu8str_view_cstr(mcplcfg_const_shlibname());

  if ( MCPLCFG_STREQUALCONST(item,"cmakedir") )
    return mcplcfg_cmakedir(state);

  if ( MCPLCFG_STREQUALCONST(item,"build_type") )
    return mcu8str_view_cstr(mcplcfg_const_cmakebuildtype());

  //Get here on errors:
  mcu8str error;
  error.c_str = NULL;
  error.size = error.buflen = 0;
  error.owns_memory = 0;
  return error;
}